

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

bool arangodb::velocypack::Collection::any(Slice slice,Predicate *predicate)

{
  ValueLength VVar1;
  ValueLength VVar2;
  bool bVar3;
  unsigned_long __args_1;
  Slice s;
  ArrayIterator it;
  Slice local_58;
  ArrayIterator local_50;
  
  ArrayIterator::ArrayIterator(&local_50,slice);
  __args_1 = 0;
  while( true ) {
    VVar2 = local_50._position;
    VVar1 = local_50._size;
    if (local_50._position == local_50._size) break;
    local_58 = ArrayIterator::value(&local_50);
    bVar3 = std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::operator()
                      (predicate,&local_58,__args_1);
    if (bVar3) break;
    ArrayIterator::next(&local_50);
    __args_1 = __args_1 + 1;
  }
  return VVar2 != VVar1;
}

Assistant:

bool Collection::any(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (predicate(s, index)) {
      return true;
    }
    it.next();
    ++index;
  }

  return false;
}